

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Mix_1in_2out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float baseVolume,float *src,
               float *dst,float *channelVolume,float *coefficients)

{
  float fVar1;
  float fVar2;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float sample;
  float totalVolume;
  uint32_t i;
  float *channelVolume_local;
  float *dst_local;
  float *src_local;
  float baseVolume_local;
  uint32_t UNUSED2_local;
  uint32_t UNUSED1_local;
  uint32_t toMix_local;
  
  fVar1 = *channelVolume;
  dst_local = dst;
  src_local = src;
  for (i = 0; i < toMix; i = i + 1) {
    fVar2 = *src_local * baseVolume * fVar1;
    *dst_local = fVar2 * *coefficients + *dst_local;
    dst_local[1] = fVar2 * coefficients[1] + dst_local[1];
    if (*dst_local <= 16777216.0) {
      if (-16777216.0 < *dst_local || *dst_local == -16777216.0) {
        local_3c = *dst_local;
      }
      else {
        local_3c = -16777216.0;
      }
      local_38 = local_3c;
    }
    else {
      local_38 = 16777216.0;
    }
    *dst_local = local_38;
    if (dst_local[1] <= 16777216.0) {
      if (-16777216.0 < dst_local[1] || dst_local[1] == -16777216.0) {
        local_44 = dst_local[1];
      }
      else {
        local_44 = -16777216.0;
      }
      local_40 = local_44;
    }
    else {
      local_40 = 16777216.0;
    }
    dst_local[1] = local_40;
    src_local = src_local + 1;
    dst_local = dst_local + 2;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_2out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float baseVolume,
	float *restrict src,
	float *restrict dst,
	float *restrict channelVolume,
	float *restrict coefficients
) {
	uint32_t i;
	float totalVolume = baseVolume * channelVolume[0];
	for (i = 0; i < toMix; i += 1, src += 1, dst += 2)
	{
		/* Base source data... */
		const float sample = src[0] * totalVolume;

		/* ... combined with the coefficients... */
		dst[0] += sample * coefficients[0];
		dst[1] += sample * coefficients[1];

		/* ... then clamped. */
		dst[0] = FAudio_clamp(
			dst[0],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
		dst[1] = FAudio_clamp(
			dst[1],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
	}
}